

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

function<int_()> * __thiscall
cmake::BuildWorkflowStep
          (function<int_()> *__return_storage_ptr__,cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmUVProcessChainBuilder *pcVar1;
  StdioConfiguration *pSVar2;
  cmUVProcessChainBuilder builder;
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  local_60;
  cmUVProcessChainBuilder local_48;
  
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_48);
  pcVar1 = cmUVProcessChainBuilder::AddCommand(&local_48,args);
  pcVar1 = cmUVProcessChainBuilder::SetExternalStream(pcVar1,Stream_OUTPUT,1);
  cmUVProcessChainBuilder::SetExternalStream(pcVar1,Stream_ERROR,2);
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::vector(&local_60,&local_48.Processes);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  pSVar2 = (StdioConfiguration *)operator_new(0x30);
  pSVar2[2] = local_48.Stdio._M_elems[2];
  *pSVar2 = local_48.Stdio._M_elems[0];
  pSVar2[1] = local_48.Stdio._M_elems[1];
  pSVar2[3] = (StdioConfiguration)
              local_60.
              super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pSVar2[4] = (StdioConfiguration)
              local_60.
              super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  pSVar2[5] = (StdioConfiguration)
              local_60.
              super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_60.
  super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.
  super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.
  super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(StdioConfiguration **)&(__return_storage_ptr__->super__Function_base)._M_functor = pSVar2;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:3746:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:3746:10)>
       ::_M_manager;
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_60);
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_48.Processes);
  return __return_storage_ptr__;
}

Assistant:

std::function<int()> cmake::BuildWorkflowStep(
  const std::vector<std::string>& args)
{
  cmUVProcessChainBuilder builder;
  builder
    .AddCommand(args)
#  ifdef _WIN32
    .SetExternalStream(cmUVProcessChainBuilder::Stream_OUTPUT, _fileno(stdout))
    .SetExternalStream(cmUVProcessChainBuilder::Stream_ERROR, _fileno(stderr));
#  else
    .SetExternalStream(cmUVProcessChainBuilder::Stream_OUTPUT, STDOUT_FILENO)
    .SetExternalStream(cmUVProcessChainBuilder::Stream_ERROR, STDERR_FILENO);
#  endif
  return [builder]() -> int {
    auto chain = builder.Start();
    chain.Wait();
    return static_cast<int>(chain.GetStatus().front()->ExitStatus);
  };
}